

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadProgram.cpp
# Opt level: O2

string * ReadProgram_abi_cxx11_(void)

{
  char cVar1;
  long *plVar2;
  ostream *poVar3;
  string *in_RDI;
  char ch;
  ifstream in;
  
  std::ifstream::ifstream(&in);
  std::ifstream::open((char *)&in,0x11f004);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to open file.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::string((string *)in_RDI,"",(allocator *)&ch);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    while( true ) {
      plVar2 = (long *)std::istream::get((char *)&in);
      if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
      std::__cxx11::string::push_back((char)in_RDI);
    }
  }
  std::ifstream::~ifstream(&in);
  return in_RDI;
}

Assistant:

std::string ReadProgram() {
    char *inputfilename = "test.txt";
    std::ifstream in;
    in.open(inputfilename);
    if (!in.is_open()) {//未能打开文件
        std::cout << "Failed to open file." << std::endl;
        return "";
    }
    char ch;
    std::string ret;
    while (in.get(ch)) {
        ret += ch;
    }
    return ret;
}